

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

x86Reg GenCodeLoadInt32FromRegister(CodeGenRegVmContext *ctx,uchar reg,bool readOnly)

{
  bool bVar1;
  x86Reg local_18;
  x86Reg lhsReg;
  bool readOnly_local;
  uchar reg_local;
  CodeGenRegVmContext *ctx_local;
  
  local_18 = CodeGenGenericContext::FindRegAtMemory
                       (&ctx->ctx,sDWORD,rNONE,1,rEBX,(uint)reg << 3,true);
  if (((local_18 == rRegCount) ||
      (bVar1 = CodeGenGenericContext::IsRegLocked(&ctx->ctx,local_18), bVar1)) ||
     ((!readOnly &&
      (bVar1 = CodeGenGenericContext::IsLastRegVmRegisterUse
                         (&ctx->ctx,reg,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset)
      , !bVar1)))) {
    local_18 = CodeGenGenericContext::GetReg(&ctx->ctx);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,local_18,sDWORD,rEBX,(uint)reg << 3);
  }
  else {
    CodeGenGenericContext::LockReg(&ctx->ctx,local_18);
  }
  return local_18;
}

Assistant:

x86Reg GenCodeLoadInt32FromRegister(CodeGenRegVmContext &ctx, unsigned char reg, bool readOnly)
{
	x86Reg lhsReg = ctx.ctx.FindRegAtMemory(sDWORD, rNONE, 1, rREG, reg * 8, true);

	if(lhsReg != rRegCount && !ctx.ctx.IsRegLocked(lhsReg) && (readOnly || ctx.ctx.IsLastRegVmRegisterUse(reg, ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset)))
	{
		ctx.ctx.LockReg(lhsReg);
	}
	else
	{
		lhsReg = ctx.ctx.GetReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, lhsReg, sDWORD, rREG, reg * 8); // Load lhs
	}

	return lhsReg;
}